

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_util.cpp
# Opt level: O0

void Kumu::GenRandomUUID(byte_t *buf)

{
  FortunaRNG local_11;
  byte_t *pbStack_10;
  FortunaRNG RNG;
  byte_t *buf_local;
  
  pbStack_10 = buf;
  FortunaRNG::FortunaRNG(&local_11);
  FortunaRNG::FillRandom(&local_11,pbStack_10,0x10);
  pbStack_10[6] = pbStack_10[6] & 0xf;
  pbStack_10[6] = pbStack_10[6] | 0x40;
  pbStack_10[8] = pbStack_10[8] & 0x3f;
  pbStack_10[8] = pbStack_10[8] | 0x80;
  FortunaRNG::~FortunaRNG(&local_11);
  return;
}

Assistant:

void
Kumu::GenRandomUUID(byte_t* buf)
{
  FortunaRNG RNG;
  RNG.FillRandom(buf, UUID_Length);
  buf[6] &= 0x0f; // clear bits 4-7
  buf[6] |= 0x40; // set UUID version
  buf[8] &= 0x3f; // clear bits 6&7
  buf[8] |= 0x80; // set bit 7
}